

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall
caffe::DummyDataParameter::MergeFrom(DummyDataParameter *this,DummyDataParameter *from)

{
  int iVar1;
  void *pvVar2;
  LogMessage *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x6082);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::FillerParameter>::TypeHandler>
            (&(this->data_filler_).super_RepeatedPtrFieldBase,
             &(from->data_filler_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->num_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->num_,iVar1 + (this->num_).current_size_);
    memcpy(((this->num_).rep_)->elements + (this->num_).current_size_,((from->num_).rep_)->elements,
           (long)(from->num_).current_size_ << 2);
    (this->num_).current_size_ = (this->num_).current_size_ + (from->num_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->channels_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->channels_,iVar1 + (this->channels_).current_size_);
    memcpy(((this->channels_).rep_)->elements + (this->channels_).current_size_,
           ((from->channels_).rep_)->elements,(long)(from->channels_).current_size_ << 2);
    (this->channels_).current_size_ =
         (this->channels_).current_size_ + (from->channels_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->height_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->height_,iVar1 + (this->height_).current_size_);
    memcpy(((this->height_).rep_)->elements + (this->height_).current_size_,
           ((from->height_).rep_)->elements,(long)(from->height_).current_size_ << 2);
    (this->height_).current_size_ = (this->height_).current_size_ + (from->height_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = (from->width_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->width_,iVar1 + (this->width_).current_size_);
    memcpy(((this->width_).rep_)->elements + (this->width_).current_size_,
           ((from->width_).rep_)->elements,(long)(from->width_).current_size_ << 2);
    (this->width_).current_size_ = (this->width_).current_size_ + (from->width_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(this->shape_).super_RepeatedPtrFieldBase,&(from->shape_).super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void DummyDataParameter::MergeFrom(const DummyDataParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.DummyDataParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  data_filler_.MergeFrom(from.data_filler_);
  num_.MergeFrom(from.num_);
  channels_.MergeFrom(from.channels_);
  height_.MergeFrom(from.height_);
  width_.MergeFrom(from.width_);
  shape_.MergeFrom(from.shape_);
}